

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::ServiceDescriptorProto::Clear(ServiceDescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  long lVar3;
  
  bVar1 = (byte)this->_has_bits_[0];
  if (bVar1 != 0) {
    if (((bVar1 & 1) != 0) &&
       (psVar2 = this->name_, psVar2 != (string *)internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_[0] & 4) != 0) && (this->options_ != (ServiceOptions *)0x0)) {
      ServiceOptions::Clear(this->options_);
    }
  }
  if (0 < (this->method_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      (**(code **)(*(this->method_).super_RepeatedPtrFieldBase.elements_[lVar3] + 0x20))();
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->method_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->method_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void ServiceDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::ServiceOptions::Clear();
    }
  }
  method_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}